

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_0::ShardedLRUCache::Erase(ShardedLRUCache *this,Slice *key)

{
  long lVar1;
  uint32_t hash;
  uint uVar2;
  LRUHandle *e;
  Mutex *__mutex;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hash = HashSlice(key);
  uVar2 = hash >> 0x1c;
  __mutex = &this->shard_[uVar2].mutex_;
  std::mutex::lock(&__mutex->mu_);
  e = HandleTable::Remove(&this->shard_[uVar2].table_,key,hash);
  LRUCache::FinishErase(this->shard_ + uVar2,e);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Erase(const Slice& key) override {
    const uint32_t hash = HashSlice(key);
    shard_[Shard(hash)].Erase(key, hash);
  }